

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::bson::basic_bson_cursor<jsoncons::bytes_source,std::allocator<char>>::
reset<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
          (basic_bson_cursor<jsoncons::bytes_source,_std::allocator<char>_> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *source,error_code *ec)

{
  ulong uVar1;
  undefined8 in_RDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_> *unaff_retaddr;
  
  basic_bson_parser<jsoncons::bytes_source,std::allocator<char>>::
  reset<std::vector<unsigned_char,std::allocator<unsigned_char>>&>(unaff_retaddr,in_RDI);
  basic_staj_visitor<char>::reset((basic_staj_visitor<char> *)this);
  *(undefined1 *)
   &in_RDI[0xb].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  uVar1 = (**(code **)((in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start + 0x18))();
  if ((uVar1 & 1) == 0) {
    (**(code **)((in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start + 0x40))(in_RDI,in_RDX);
  }
  return;
}

Assistant:

void reset(Sourceable&& source, std::error_code& ec)
    {
        parser_.reset(std::forward<Sourceable>(source));
        cursor_visitor_.reset();
        eof_ = false;
        if (!done())
        {
            next(ec);
        }
    }